

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O0

__pid_t __thiscall depspawn::internal::TaskPool::wait(TaskPool *this,void *__stat_loc)

{
  byte bVar1;
  __pid_t _Var2;
  __pid_t extraout_EAX;
  void *__stat_loc_00;
  memory_order __b;
  TaskPool *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd8;
  
  bVar1 = (byte)__stat_loc & 1;
  do {
    empty_queue(in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc0 = (TaskPool *)&this->busy_threads_;
    __stat_loc_00 = (void *)0xffff;
    std::operator&(memory_order_relaxed,__memory_order_mask);
  } while (*(int *)&(in_stack_ffffffffffffffc0->thread_pool_).threads_.
                    super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start != 0);
  this->finish_ = true;
  _Var2 = ThreadPool::wait(&this->thread_pool_,__stat_loc_00);
  if ((bVar1 & 1) != 0) {
    launch_threads((TaskPool *)CONCAT17(bVar1,in_stack_ffffffffffffffd8));
    _Var2 = extraout_EAX;
  }
  return _Var2;
}

Assistant:

void wait(const bool relaunch_threads = true)
  {
    do {
      empty_queue();
    } while(busy_threads_.load(std::memory_order_relaxed));

    finish_ = true;
    thread_pool_.wait();

    if (relaunch_threads) {
      launch_threads();
    }
  }